

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O1

Net * __thiscall notch::core::MakeNet::make(Net *__return_storage_ptr__,MakeNet *this)

{
  undefined4 *puVar1;
  LayerType LVar2;
  pointer pMVar3;
  logic_error *this_00;
  long lVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  ulong uVar5;
  value_type lmaker;
  MakeLayer local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  undefined8 local_88;
  shared_ptr<notch::core::ALossLayer> local_80;
  shared_ptr<notch::core::ALossLayer> local_70;
  shared_ptr<notch::core::ALossLayer> local_60;
  shared_ptr<notch::core::ABackpropLayer> local_50;
  shared_ptr<notch::core::ABackpropLayer> local_40;
  
  __return_storage_ptr__->_vptr_Net = (_func_int **)&PTR_append_001a5918;
  (__return_storage_ptr__->layers).
  super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->layers).
  super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->layers).
  super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->lossLayer).
  super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->lossLayer).
  super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pMVar3 = (this->layerMakers).
           super__Vector_base<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->layerMakers).
      super__Vector_base<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>._M_impl.
      super__Vector_impl_data._M_finish != pMVar3) {
    lVar4 = 0xc;
    uVar5 = 0;
    do {
      LVar2 = (this->layerTypes).
              super__Vector_base<notch::core::MakeNet::LayerType,_std::allocator<notch::core::MakeNet::LayerType>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar5];
      puVar1 = (undefined4 *)((long)pMVar3 + lVar4 * 4 + -0x30);
      local_c8.maybeWeights.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr._0_4_ = *puVar1;
      local_c8.maybeWeights.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr._4_4_ = puVar1[1];
      local_c8.maybeWeights.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._0_4_ = puVar1[2];
      local_c8.maybeWeights.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._4_4_ = puVar1[3];
      local_c8.maybeBias.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = *(element_type **)((long)pMVar3 + lVar4 * 4 + -0x20);
      local_c8.maybeBias.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pMVar3 + lVar4 * 4 + -0x18);
      if (local_c8.maybeBias.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_c8.maybeBias.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_c8.maybeBias.
                super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_c8.maybeBias.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_c8.maybeBias.
                super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      local_c8.maybeActivation = *(Activation **)((long)pMVar3 + lVar4 * 4 + -0x10);
      local_90 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pMVar3 + lVar4 * 4 + -8);
      if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_90->_M_use_count = local_90->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_90->_M_use_count = local_90->_M_use_count + 1;
        }
      }
      local_88 = *(undefined8 *)((long)&pMVar3->nInputs + lVar4 * 4);
      switch(LVar2) {
      case FC:
        MakeLayer::FC(&local_c8);
        local_40.super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)local_c8.nInputs;
        local_40.super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.nOutputs;
        local_c8.nInputs = 0;
        local_c8.nOutputs = 0;
        Net::append(__return_storage_ptr__,&local_40);
        this_01._M_pi =
             local_40.super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        break;
      case Activation:
        MakeLayer::activation(&local_c8);
        local_50.super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)local_c8.nInputs;
        local_50.super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.nOutputs;
        local_c8.nInputs = 0;
        local_c8.nOutputs = 0;
        Net::append(__return_storage_ptr__,&local_50);
        this_01._M_pi =
             local_50.super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        break;
      case L2Loss:
        MakeLayer::L2Loss(&local_c8);
        local_60.super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_c8.nInputs;
        local_60.super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.nOutputs;
        local_c8.nInputs = 0;
        local_c8.nOutputs = 0;
        Net::append(__return_storage_ptr__,&local_60);
        this_01._M_pi =
             local_60.super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        break;
      case Softmax:
        MakeLayer::softmax(&local_c8);
        local_70.super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_c8.nInputs;
        local_70.super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.nOutputs;
        local_c8.nInputs = 0;
        local_c8.nOutputs = 0;
        Net::append(__return_storage_ptr__,&local_70);
        this_01._M_pi =
             local_70.super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        break;
      case Hinge:
        MakeLayer::hinge(&local_c8);
        local_80.super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_c8.nInputs;
        local_80.super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.nOutputs;
        local_c8.nInputs = 0;
        local_c8.nOutputs = 0;
        Net::append(__return_storage_ptr__,&local_80);
        this_01._M_pi =
             local_80.super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        break;
      default:
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        ::std::logic_error::logic_error(this_00,"unsupported layer type");
        __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
      }
      if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.nOutputs !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8.nOutputs);
      }
      if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
      }
      if (local_c8.maybeBias.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c8.maybeBias.
                   super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      uVar5 = uVar5 + 1;
      pMVar3 = (this->layerMakers).
               super__Vector_base<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0xe;
    } while (uVar5 < (ulong)(((long)(this->layerMakers).
                                    super__Vector_base<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar3 >> 3)
                            * 0x6db6db6db6db6db7));
  }
  return __return_storage_ptr__;
}

Assistant:

Net make() {
        Net net;
        for (size_t i = 0; i < layerMakers.size(); ++i) {
            auto ltype = layerTypes[i];
            auto lmaker = layerMakers[i];
            switch (ltype) {
                case LayerType::FC:
                    net.append(lmaker.FC()); break;
                case LayerType::Activation:
                    net.append(lmaker.activation()); break;
                case LayerType::L2Loss:
                    net.append(lmaker.L2Loss()); break;
                case LayerType::Softmax:
                    net.append(lmaker.softmax()); break;
                case LayerType::Hinge:
                    net.append(lmaker.hinge()); break;
                default:
                    throw std::logic_error("unsupported layer type"); break;
            }
        }
        return net;
    }